

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLinLog>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  int iVar8;
  GetterXsYs<unsigned_int> *pGVar9;
  TransformerLinLog *pTVar10;
  ImPlotPlot *pIVar11;
  GetterXsYRef<unsigned_int> *pGVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  double dVar15;
  ImVec2 IVar16;
  ushort uVar17;
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  bool bVar20;
  long lVar21;
  ImDrawIdx IVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  ImVec2 IVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  
  pIVar18 = GImPlot;
  pGVar9 = this->Getter1;
  pTVar10 = this->Transformer;
  iVar8 = pGVar9->Count;
  lVar21 = (long)(((pGVar9->Offset + prim + 1) % iVar8 + iVar8) % iVar8) * (long)pGVar9->Stride;
  uVar23 = *(uint *)((long)pGVar9->Xs + lVar21);
  dVar15 = log10((double)*(uint *)((long)pGVar9->Ys + lVar21) /
                 GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  pIVar19 = GImPlot;
  iVar8 = pTVar10->YAxis;
  pIVar11 = pIVar18->CurrentPlot;
  dVar7 = pIVar11->YAxis[iVar8].Range.Min;
  fVar25 = (float)(((double)uVar23 - (pIVar11->XAxis).Range.Min) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar8].Min.x);
  fVar24 = (float)((((double)(float)(dVar15 / pIVar18->LogDenY[iVar8]) *
                     (pIVar11->YAxis[iVar8].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar18->My[iVar8] + (double)pIVar18->PixelRange[iVar8].Min.y);
  pGVar12 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar8 = pGVar12->Count;
  uVar23 = *(uint *)((long)pGVar12->Xs +
                    (long)(((prim + 1 + pGVar12->Offset) % iVar8 + iVar8) % iVar8) *
                    (long)pGVar12->Stride);
  dVar15 = log10(pGVar12->YRef / GImPlot->CurrentPlot->YAxis[pTVar10->YAxis].Range.Min);
  iVar8 = pTVar10->YAxis;
  pIVar11 = pIVar19->CurrentPlot;
  dVar7 = pIVar11->YAxis[iVar8].Range.Min;
  fVar29 = (float)(((double)uVar23 - (pIVar11->XAxis).Range.Min) * pIVar19->Mx +
                  (double)pIVar19->PixelRange[iVar8].Min.x);
  fVar31 = (float)((((double)(float)(dVar15 / pIVar19->LogDenY[iVar8]) *
                     (pIVar11->YAxis[iVar8].Range.Max - dVar7) + dVar7) - dVar7) *
                   pIVar19->My[iVar8] + (double)pIVar19->PixelRange[iVar8].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar27 = fVar3;
  if (fVar5 <= fVar3) {
    fVar27 = fVar5;
  }
  if (fVar24 <= fVar27) {
    fVar27 = fVar24;
  }
  if (fVar31 <= fVar27) {
    fVar27 = fVar31;
  }
  bVar20 = false;
  if ((fVar27 < (cull_rect->Max).y) &&
     (fVar27 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar23 = -(uint)(fVar24 <= fVar27),
     fVar27 = (float)(~uVar23 & (uint)fVar24 | uVar23 & (uint)fVar27),
     uVar23 = -(uint)(fVar31 <= fVar27),
     fVar27 = (float)(~uVar23 & (uint)fVar31 | uVar23 & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar27 && fVar27 != *pfVar1)) {
    fVar27 = fVar2;
    if (fVar4 <= fVar2) {
      fVar27 = fVar4;
    }
    if (fVar25 <= fVar27) {
      fVar27 = fVar25;
    }
    if (fVar29 <= fVar27) {
      fVar27 = fVar29;
    }
    bVar20 = false;
    if (fVar27 < (cull_rect->Max).x) {
      fVar27 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar23 = -(uint)(fVar25 <= fVar27);
      fVar27 = (float)(~uVar23 & (uint)fVar25 | uVar23 & (uint)fVar27);
      uVar23 = -(uint)(fVar29 <= fVar27);
      fVar27 = (float)(~uVar23 & (uint)fVar29 | uVar23 & (uint)fVar27);
      bVar20 = (cull_rect->Min).x <= fVar27 && fVar27 != (cull_rect->Min).x;
    }
  }
  IVar26.y = fVar24;
  IVar26.x = fVar25;
  IVar28.y = fVar31;
  IVar28.x = fVar29;
  if (bVar20 != false) {
    fVar27 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar33 = fVar2 * fVar24 - fVar25 * fVar3;
    fVar32 = fVar4 * fVar31 - fVar29 * fVar5;
    fVar30 = (fVar2 - fVar25) * (fVar5 - fVar31) - (fVar4 - fVar29) * (fVar3 - fVar24);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = this->Col;
    pIVar13[1].pos = IVar26;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = this->Col;
    IVar16.y = ((fVar5 - fVar31) * fVar33 - (fVar3 - fVar24) * fVar32) / fVar30;
    IVar16.x = (fVar33 * (fVar4 - fVar29) - (fVar2 - fVar25) * fVar32) / fVar30;
    pIVar13[2].pos = IVar16;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = this->Col;
    pIVar13[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = this->Col;
    pIVar13[4].pos = IVar28;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar13 + 5;
    uVar23 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar22 = (ImDrawIdx)uVar23;
    *pIVar14 = IVar22;
    uVar17 = -(ushort)(fVar6 < fVar27 && fVar24 < fVar31 || fVar27 < fVar6 && fVar31 < fVar24) & 1;
    pIVar14[1] = IVar22 + uVar17 + 1;
    pIVar14[2] = IVar22 + 3;
    pIVar14[3] = IVar22 + 1;
    pIVar14[4] = (uVar17 ^ 3) + IVar22;
    pIVar14[5] = IVar22 + 4;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar23 + 5;
  }
  this->P11 = IVar26;
  this->P12 = IVar28;
  return bVar20;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }